

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

void Wln_NtkPrint(Wln_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int local_14;
  int iObj;
  Wln_Ntk_t *p_local;
  
  uVar1 = Wln_NtkObjNum(p);
  printf("Printing %d objects of network \"%s\":\n",(ulong)uVar1,p->pName);
  local_14 = 1;
  while( true ) {
    iVar2 = Wln_NtkObjNum(p);
    if (iVar2 <= local_14) break;
    Wln_ObjPrint(p,local_14);
    local_14 = local_14 + 1;
  }
  printf("\n");
  return;
}

Assistant:

void Wln_NtkPrint( Wln_Ntk_t * p )
{
    int iObj;
    printf( "Printing %d objects of network \"%s\":\n", Wln_NtkObjNum(p), p->pName );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjPrint( p, iObj );
    printf( "\n" );
}